

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::processCommandInstruction(CoreBroker *this,ActionMessage *message)

{
  string_view searchValue;
  string_view searchValue_00;
  string_view searchValue_01;
  string_view searchValue_02;
  bool bVar1;
  __type _Var2;
  route_id rVar3;
  pointer pBVar4;
  pointer pBVar5;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  broker_1;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed_1;
  route_id route_1;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  broker;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed;
  route_id route;
  string *target;
  ActionMessage *in_stack_000003f0;
  CoreBroker *in_stack_000003f8;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffffed8;
  ActionMessage *in_stack_fffffffffffffee0;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *this_00;
  ActionMessage *in_stack_fffffffffffffee8;
  CoreBroker *in_stack_fffffffffffffef8;
  CoreBroker *this_01;
  GlobalFederateId in_stack_ffffffffffffff00;
  GlobalFederateId fedid;
  undefined4 uVar6;
  GlobalFederateId local_dc;
  BasicBrokerInfo *local_d8;
  __sv_type local_d0;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_c0;
  uint local_b4;
  BasicFedInfo *local_b0;
  __sv_type local_a8;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_98;
  uint local_90;
  BaseType local_8c;
  BaseType local_88;
  BaseType local_84;
  GlobalFederateId local_80;
  uint local_7c;
  BaseType local_78;
  GlobalFederateId local_74;
  BasicBrokerInfo *local_70;
  __sv_type local_68;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_58;
  uint local_4c;
  BasicFedInfo *local_48;
  __sv_type local_40;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_30;
  uint local_24;
  string *local_20;
  undefined4 local_18;
  BaseType local_14;
  ActionMessage *local_10;
  
  local_14 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  local_10 = in_RSI;
  bVar1 = GlobalFederateId::operator==(&in_RSI->dest_id,(GlobalBrokerId)local_14);
  if (bVar1) {
    processLocalCommandInstruction(in_stack_000003f8,in_stack_000003f0);
  }
  else {
    local_18 = 0;
    bVar1 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)0x0);
    if (bVar1) {
      local_20 = ActionMessage::getString_abi_cxx11_
                           (in_stack_fffffffffffffee8,
                            (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      if (!bVar1) {
        fedid.gid = (BaseType)local_20;
        uVar6 = (undefined4)((ulong)local_20 >> 0x20);
        getIdentifier_abi_cxx11_(in_RDI);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(uVar6,fedid.gid),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffef8);
        if (!_Var2) {
          if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
            local_90 = 0;
            local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffee0);
            searchValue_01._M_len._4_4_ = uVar6;
            searchValue_01._M_len._0_4_ = fedid.gid;
            searchValue_01._M_str = (char *)in_RDI;
            local_98 = gmlc::containers::
                       DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                       ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                               *)in_stack_fffffffffffffef8,searchValue_01);
            local_b0 = (BasicFedInfo *)
                       gmlc::containers::
                       DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                       ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                              *)in_stack_fffffffffffffed8);
            bVar1 = __gnu_cxx::
                    operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                              ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                                *)in_stack_fffffffffffffee0,
                               (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                                *)in_stack_fffffffffffffed8);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              pBVar4 = __gnu_cxx::
                       __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                       ::operator->(&local_98);
              local_90 = (pBVar4->route).rid;
              pBVar4 = __gnu_cxx::
                       __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                       ::operator->(&local_98);
              (local_10->dest_id).gid = (pBVar4->global_id).gid;
              local_b4 = local_90;
              (*(in_RDI->super_Broker)._vptr_Broker[0x23])(in_RDI,(ulong)local_90,local_10);
              return;
            }
            this_00 = &in_RDI->mBrokers;
            local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_00);
            searchValue_02._M_len._4_4_ = uVar6;
            searchValue_02._M_len._0_4_ = fedid.gid;
            searchValue_02._M_str = (char *)in_RDI;
            local_c0 = gmlc::containers::
                       DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                       ::find((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                               *)in_stack_fffffffffffffef8,searchValue_02);
            local_d8 = (BasicBrokerInfo *)
                       gmlc::containers::
                       DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                       ::end(in_stack_fffffffffffffed8);
            bVar1 = __gnu_cxx::
                    operator==<helics::BasicBrokerInfo_*,_const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                              ((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                *)this_00,
                               (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                *)in_stack_fffffffffffffed8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              (*(in_RDI->super_Broker)._vptr_Broker[0x23])(in_RDI,0,local_10);
              return;
            }
            pBVar5 = __gnu_cxx::
                     __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                     ::operator->(&local_c0);
            local_90 = (pBVar5->route).rid;
            pBVar5 = __gnu_cxx::
                     __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                     ::operator->(&local_c0);
            GlobalFederateId::GlobalFederateId(&local_dc,(GlobalBrokerId)(pBVar5->global_id).gid);
            (local_10->dest_id).gid = local_dc.gid;
            (*(in_RDI->super_Broker)._vptr_Broker[0x23])(in_RDI,(ulong)local_90,local_10);
            return;
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8
                                     ), bVar1)) {
            processLocalCommandInstruction(in_stack_000003f8,in_stack_000003f0);
            return;
          }
          local_24 = 0;
          this_01 = (CoreBroker *)&in_RDI->mFederates;
          local_40 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffee0);
          searchValue._M_len._4_4_ = uVar6;
          searchValue._M_len._0_4_ = fedid.gid;
          searchValue._M_str = (char *)in_RDI;
          local_30 = gmlc::containers::
                     DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                     ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                             *)this_01,searchValue);
          local_48 = (BasicFedInfo *)
                     gmlc::containers::
                     DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                     ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                            *)in_stack_fffffffffffffed8);
          bVar1 = __gnu_cxx::
                  operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                            ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                              *)in_stack_fffffffffffffee0,
                             (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                              *)in_stack_fffffffffffffed8);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pBVar4 = __gnu_cxx::
                     __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                     ::operator->(&local_30);
            local_24 = (pBVar4->route).rid;
            pBVar4 = __gnu_cxx::
                     __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                     ::operator->(&local_30);
            (local_10->dest_id).gid = (pBVar4->global_id).gid;
            local_4c = local_24;
            (*(in_RDI->super_Broker)._vptr_Broker[0x23])(in_RDI,(ulong)local_24,local_10);
            return;
          }
          local_68 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffee0);
          searchValue_00._M_len._4_4_ = uVar6;
          searchValue_00._M_len._0_4_ = fedid.gid;
          searchValue_00._M_str = (char *)in_RDI;
          local_58 = gmlc::containers::
                     DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                     ::find((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                             *)this_01,searchValue_00);
          local_70 = (BasicBrokerInfo *)
                     gmlc::containers::
                     DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                     ::end(in_stack_fffffffffffffed8);
          bVar1 = __gnu_cxx::
                  operator==<helics::BasicBrokerInfo_*,_const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                            ((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                              *)in_stack_fffffffffffffee0,
                             (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                              *)in_stack_fffffffffffffed8);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            ActionMessage::swapSourceDest(in_stack_fffffffffffffee0);
            local_84 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
            GlobalFederateId::GlobalFederateId(&local_80,(GlobalBrokerId)local_84);
            (local_10->source_id).gid = local_80.gid;
            ActionMessage::setAction(local_10,cmd_error);
            SmallBuffer::operator=((SmallBuffer *)in_RDI,(char (*) [36])CONCAT44(uVar6,fedid.gid));
            local_8c = (local_10->dest_id).gid;
            local_88 = (BaseType)getRoute(this_01,fedid);
            (*(in_RDI->super_Broker)._vptr_Broker[0x23])(in_RDI,(ulong)(uint)local_88,local_10);
            return;
          }
          pBVar5 = __gnu_cxx::
                   __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                   ::operator->(&local_58);
          local_24 = (pBVar5->route).rid;
          pBVar5 = __gnu_cxx::
                   __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                   ::operator->(&local_58);
          local_78 = (pBVar5->global_id).gid;
          GlobalFederateId::GlobalFederateId(&local_74,(GlobalBrokerId)local_78);
          (local_10->dest_id).gid = local_74.gid;
          local_7c = local_24;
          (*(in_RDI->super_Broker)._vptr_Broker[0x23])(in_RDI,(ulong)local_24,local_10);
          return;
        }
      }
      processLocalCommandInstruction(in_stack_000003f8,in_stack_000003f0);
    }
    else {
      rVar3 = getRoute(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
      (*(in_RDI->super_Broker)._vptr_Broker[0x23])(in_RDI,(ulong)(uint)rVar3.rid,local_10);
    }
  }
  return;
}

Assistant:

void CoreBroker::processCommandInstruction(ActionMessage& message)
{
    if (message.dest_id == global_broker_id_local) {
        processLocalCommandInstruction(message);
    } else if (message.dest_id == parent_broker_id) {
        const auto& target = message.getString(targetStringLoc);
        if (target == "broker" || target == getIdentifier()) {
            processLocalCommandInstruction(message);
        } else if (isRootc) {
            if (target == "federation" || target == "root") {
                processLocalCommandInstruction(message);
            } else {
                route_id route = parent_route_id;
                auto fed = mFederates.find(target);
                if (fed != mFederates.end()) {
                    route = fed->route;
                    message.dest_id = fed->global_id;
                    transmit(route, std::move(message));
                } else {
                    auto broker = mBrokers.find(target);
                    if (broker != mBrokers.end()) {
                        route = broker->route;
                        message.dest_id = broker->global_id;
                        transmit(route, std::move(message));
                    } else {
                        message.swapSourceDest();
                        message.source_id = global_broker_id_local;
                        message.setAction(CMD_ERROR);
                        message.payload = "unable to locate target for command";
                        transmit(getRoute(message.dest_id), std::move(message));
                    }
                }
            }
        } else {
            route_id route = parent_route_id;
            auto fed = mFederates.find(target);
            if (fed != mFederates.end()) {
                route = fed->route;
                message.dest_id = fed->global_id;
                transmit(route, std::move(message));
            } else {
                auto broker = mBrokers.find(target);
                if (broker != mBrokers.end()) {
                    route = broker->route;
                    message.dest_id = broker->global_id;
                    transmit(route, std::move(message));
                } else {
                    transmit(parent_route_id, std::move(message));
                }
            }
        }
    } else {
        transmit(getRoute(message.dest_id), std::move(message));
    }
}